

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,
         SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  char ret;
  char local_22;
  char local_21;
  unsigned_long_long local_20;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_22 = '\0';
  local_21 = lhs;
  local_20 = rhs.m_int;
  DivisionHelper<char,_unsigned_long_long,_3>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_21,&local_20,&local_22);
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            (&local_18,&local_22);
  return (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_18.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}